

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall cmGeneratorTarget::IsIPOEnabled(cmGeneratorTarget *this,string *lang,string *config)

{
  cmMakefile *pcVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  cmake *pcVar5;
  ostream *poVar6;
  string *psVar7;
  PolicyID id;
  cmListFileBacktrace local_360;
  allocator local_339;
  string local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  char *local_298;
  char *message;
  string local_270;
  string local_250;
  undefined1 local_230 [8];
  ostringstream w;
  undefined1 local_b0 [7];
  bool in_try_compile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  PolicyStatus local_70;
  PolicyStatus cmp0069;
  allocator local_59;
  string local_58;
  undefined1 local_31;
  char *pcStack_30;
  bool result;
  char *feature;
  string *config_local;
  string *lang_local;
  cmGeneratorTarget *this_local;
  
  pcStack_30 = "INTERPROCEDURAL_OPTIMIZATION";
  feature = (char *)config;
  config_local = lang;
  lang_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"INTERPROCEDURAL_OPTIMIZATION",&local_59);
  pcVar4 = GetFeature(this,&local_58,(string *)feature);
  bVar2 = cmSystemTools::IsOn(pcVar4);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  if (bVar2) {
    local_31 = bVar2;
    bVar2 = std::operator!=(config_local,"C");
    if (((bVar2) && (bVar2 = std::operator!=(config_local,"CXX"), bVar2)) &&
       (bVar2 = std::operator!=(config_local,"Fortran"), bVar2)) {
      this_local._7_1_ = false;
    }
    else {
      local_70 = GetPolicyStatusCMP0069(this);
      if ((local_70 == OLD) || (local_70 == WARN)) {
        pcVar1 = this->Makefile;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0
                       ,"_CMAKE_",config_local);
        std::operator+(&local_90,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0
                       ,"_IPO_LEGACY_BEHAVIOR");
        bVar2 = cmMakefile::IsOn(pcVar1,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)local_b0);
        if (bVar2) {
          this_local._7_1_ = true;
        }
        else if ((this->PolicyReportedCMP0069 & 1U) == 0) {
          pcVar5 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
          bVar2 = cmake::GetIsInTryCompile(pcVar5);
          if ((local_70 == WARN) && (!bVar2)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_230);
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_250,(cmPolicies *)0x45,id);
            poVar6 = std::operator<<((ostream *)local_230,(string *)&local_250);
            std::operator<<(poVar6,"\n");
            std::__cxx11::string::~string((string *)&local_250);
            poVar6 = std::operator<<((ostream *)local_230,
                                     "INTERPROCEDURAL_OPTIMIZATION property will be ignored for target "
                                    );
            poVar6 = std::operator<<(poVar6,"\'");
            psVar7 = GetName_abi_cxx11_(this);
            poVar6 = std::operator<<(poVar6,(string *)psVar7);
            std::operator<<(poVar6,"\'.");
            pcVar5 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
            std::__cxx11::ostringstream::str();
            GetBacktrace((cmListFileBacktrace *)&message,this);
            cmake::IssueMessage(pcVar5,AUTHOR_WARNING,&local_270,(cmListFileBacktrace *)&message);
            cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&message);
            std::__cxx11::string::~string((string *)&local_270);
            this->PolicyReportedCMP0069 = true;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_230);
          }
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        local_298 = (char *)0x0;
        pcVar1 = this->Makefile;
        std::operator+(&local_2d8,"_CMAKE_",config_local);
        std::operator+(&local_2b8,&local_2d8,"_IPO_SUPPORTED_BY_CMAKE");
        bVar2 = cmMakefile::IsOn(pcVar1,&local_2b8);
        std::__cxx11::string::~string((string *)&local_2b8);
        std::__cxx11::string::~string((string *)&local_2d8);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          pcVar1 = this->Makefile;
          std::operator+(&local_318,"_CMAKE_",config_local);
          std::operator+(&local_2f8,&local_318,"_IPO_MAY_BE_SUPPORTED_BY_COMPILER");
          bVar2 = cmMakefile::IsOn(pcVar1,&local_2f8);
          std::__cxx11::string::~string((string *)&local_2f8);
          std::__cxx11::string::~string((string *)&local_318);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            uVar3 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x22])();
            if ((uVar3 & 1) == 0) {
              local_298 = "CMake doesn\'t support IPO for current generator";
            }
          }
          else {
            local_298 = "Compiler doesn\'t support IPO";
          }
        }
        else {
          local_298 = "CMake doesn\'t support IPO for current compiler";
        }
        if (local_298 == (char *)0x0) {
          this_local._7_1_ = true;
        }
        else if ((this->PolicyReportedCMP0069 & 1U) == 0) {
          this->PolicyReportedCMP0069 = true;
          pcVar5 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
          pcVar4 = local_298;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_338,pcVar4,&local_339);
          GetBacktrace(&local_360,this);
          cmake::IssueMessage(pcVar5,FATAL_ERROR,&local_338,&local_360);
          cmListFileBacktrace::~cmListFileBacktrace(&local_360);
          std::__cxx11::string::~string((string *)&local_338);
          std::allocator<char>::~allocator((allocator<char> *)&local_339);
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmGeneratorTarget::IsIPOEnabled(std::string const& lang,
                                     std::string const& config) const
{
  const char* feature = "INTERPROCEDURAL_OPTIMIZATION";
  const bool result = cmSystemTools::IsOn(this->GetFeature(feature, config));

  if (!result) {
    // 'INTERPROCEDURAL_OPTIMIZATION' is off, no need to check policies
    return false;
  }

  if (lang != "C" && lang != "CXX" && lang != "Fortran") {
    // We do not define IPO behavior for other languages.
    return false;
  }

  cmPolicies::PolicyStatus cmp0069 = this->GetPolicyStatusCMP0069();

  if (cmp0069 == cmPolicies::OLD || cmp0069 == cmPolicies::WARN) {
    if (this->Makefile->IsOn("_CMAKE_" + lang + "_IPO_LEGACY_BEHAVIOR")) {
      return true;
    }
    if (this->PolicyReportedCMP0069) {
      // problem is already reported, no need to issue a message
      return false;
    }
    const bool in_try_compile =
      this->LocalGenerator->GetCMakeInstance()->GetIsInTryCompile();
    if (cmp0069 == cmPolicies::WARN && !in_try_compile) {
      std::ostringstream w;
      w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0069) << "\n";
      w << "INTERPROCEDURAL_OPTIMIZATION property will be ignored for target "
        << "'" << this->GetName() << "'.";
      this->LocalGenerator->GetCMakeInstance()->IssueMessage(
        cmake::AUTHOR_WARNING, w.str(), this->GetBacktrace());

      this->PolicyReportedCMP0069 = true;
    }
    return false;
  }

  // Note: check consistency with messages from CheckIPOSupported
  const char* message = CM_NULLPTR;
  if (!this->Makefile->IsOn("_CMAKE_" + lang + "_IPO_SUPPORTED_BY_CMAKE")) {
    message = "CMake doesn't support IPO for current compiler";
  } else if (!this->Makefile->IsOn("_CMAKE_" + lang +
                                   "_IPO_MAY_BE_SUPPORTED_BY_COMPILER")) {
    message = "Compiler doesn't support IPO";
  } else if (!this->GlobalGenerator->IsIPOSupported()) {
    message = "CMake doesn't support IPO for current generator";
  }

  if (!message) {
    // No error/warning messages
    return true;
  }

  if (this->PolicyReportedCMP0069) {
    // problem is already reported, no need to issue a message
    return false;
  }

  this->PolicyReportedCMP0069 = true;

  this->LocalGenerator->GetCMakeInstance()->IssueMessage(
    cmake::FATAL_ERROR, message, this->GetBacktrace());
  return false;
}